

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

uint8_t icu_63::getCharCat(UChar32 cp)

{
  uint8_t uVar1;
  
  if ((cp < 0xfdd0) || ((uVar1 = '\x1e', 0xfdef < cp && (0x10ffff < cp || (~cp & 0xfffeU) != 0)))) {
    uVar1 = u_charType_63(cp);
    if (uVar1 == '\x12') {
      uVar1 = ' ' - ((cp & 0xfffffc00U) == 0xd800);
    }
  }
  return uVar1;
}

Assistant:

static uint8_t getCharCat(UChar32 cp) {
    uint8_t cat;

    if (U_IS_UNICODE_NONCHAR(cp)) {
        return U_NONCHARACTER_CODE_POINT;
    }

    if ((cat = u_charType(cp)) == U_SURROGATE) {
        cat = U_IS_LEAD(cp) ? U_LEAD_SURROGATE : U_TRAIL_SURROGATE;
    }

    return cat;
}